

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O0

void progressRateFR(Real *q_f,Real *q_r,Real *sc,Real T)

{
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Real sc_qss [1];
  Real g_RT [9];
  Real invT;
  Real tc [5];
  Real invT_1;
  Real T_1;
  Real F_troe;
  Real troe;
  Real troe_n;
  Real troe_c;
  Real logFcent;
  Real logPred;
  Real F;
  Real redP;
  Real Corr;
  Real k_f;
  Real refCinv;
  Real refC;
  Real g_RT_1 [9];
  int i;
  Real mixture;
  Real invT_2;
  Real T_2;
  undefined1 local_1d0 [8];
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double local_128;
  double *local_118;
  double *local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  int local_5c;
  double local_58;
  double local_50;
  double *local_48;
  undefined1 *local_40;
  double *local_38;
  double *local_30;
  double *local_28;
  double local_20;
  double *local_10;
  double *local_8;
  
  local_148 = in_XMM0_Qa;
  local_140 = in_RDX;
  local_138 = in_RSI;
  local_130 = in_RDI;
  dVar1 = log(in_XMM0_Qa);
  local_170 = local_148;
  dVar2 = local_148 * local_148;
  dVar3 = local_148 * local_148 * local_148;
  dVar4 = local_148 * local_148 * local_148 * local_148;
  local_180 = 1.0 / local_148;
  local_110 = &local_1c8;
  local_118 = &local_178;
  local_128 = 1.0 / local_148;
  if (1000.0 <= local_148) {
    local_1c8 = dVar4 * -7.91375895e-17 +
                dVar3 * 7.692981816666667e-13 +
                dVar2 * 9.389714483333333e-09 +
                local_148 * -0.0003500322055 +
                dVar1 * -2.99142337 + local_128 * -835.033997 + 4.34653354;
    local_1c0 = local_158 * 5.68217655e-17 +
                local_160 * -1.479401233333333e-12 +
                local_168 * 2.098069983333333e-08 +
                local_148 * -0.0003067598445 +
                local_178 * -3.69757819 + local_128 * -1233.93018 + 0.5084126000000002;
    local_1b8 = local_158 * 3.195808935e-16 +
                local_160 * -1.000830325e-11 +
                local_168 * 1.455043351666667e-07 +
                local_148 * -0.001528146445 +
                local_178 * -2.67214561 + local_128 * -29899.209 + -4.190671200000001;
    local_1b0 = local_158 * -0.0 +
                local_160 * -0.0 +
                local_168 * -0.0 +
                local_148 * -0.0 + local_178 * -2.5 + local_128 * 25471.627 + 2.960117638;
    local_1a8 = local_158 * 2.18402575e-17 +
                local_160 * -3.792556183333333e-13 +
                local_168 * 5.171338916666667e-10 +
                local_148 * 1.377530955e-05 +
                local_178 * -2.54205966 + local_128 * 29230.8027 + -2.37824845;
    local_1a0 = local_158 * 6.6597938e-17 +
                local_160 * -2.54348895e-12 +
                local_168 * 4.318045966666667e-08 +
                local_148 * -0.00052825224 +
                local_178 * -2.86472886 + local_128 * 3683.62875 + -2.83691187;
    local_198 = local_158 * 5.39542675e-16 +
                local_160 * -9.520530833333334e-12 +
                local_168 * 1.056096916666667e-07 +
                local_148 * -0.001119910065 +
                local_178 * -4.0172109 + local_128 * 111.856713 + 0.2321087500000001;
    local_190 = local_158 * 7.1582678e-16 +
                local_160 * -1.957419641666667e-11 +
                local_168 * 2.4578147e-07 +
                local_148 * -0.002168068195 +
                local_178 * -4.57316685 + local_128 * -18006.9609 + 4.072029891;
    local_188 = local_158 * 3.3766755e-16 +
                local_160 * -8.4142e-12 +
                local_168 * 9.474601666666666e-08 +
                local_148 * -0.0007439885 + local_178 * -2.92664 + local_128 * -922.7977 + -3.053888
    ;
  }
  else {
    local_1c8 = dVar4 * -2.06743612e-14 +
                dVar3 * 7.896195275e-12 +
                dVar2 * 1.357169215e-07 +
                local_148 * -0.000412472087 +
                dVar1 * -3.29812431 + local_128 * -1012.52087 + 6.5922184;
    local_1c0 = local_158 * 4.38427696e-14 +
                local_160 * -1.094897691666667e-10 +
                local_168 * 9.593584116666666e-08 +
                local_148 * -0.000563743175 +
                local_178 * -3.2129364 + local_128 * -1005.24902 + -2.82180119;
    local_1b8 = local_158 * 1.253294235e-13 +
                local_160 * -5.807151058333333e-10 +
                local_168 * 1.059116055e-06 +
                local_148 * -0.00173749123 +
                local_178 * -3.38684249 + local_128 * -30208.1133 + 0.7966096399999998;
    local_1b0 = local_158 * -0.0 +
                local_160 * -0.0 +
                local_168 * -0.0 +
                local_148 * -0.0 + local_178 * -2.5 + local_128 * 25471.627 + 2.960117608;
    local_1a8 = local_158 * -1.94534818e-14 +
                local_160 * 1.335702658333333e-10 +
                local_168 * -4.035052833333333e-07 +
                local_148 * 0.000819083245 +
                local_178 * -2.94642878 + local_128 * 29147.6445 + -0.01756619999999964;
    local_1a0 = local_158 * -1.031186895e-13 +
                local_160 * 4.832113691666666e-10 +
                local_168 * -1.087941151666667e-06 +
                local_148 * 0.001612724695 +
                local_178 * -4.12530561 + local_128 * 3346.30913 + 4.81573857;
    local_198 = local_158 * -4.646125620000001e-13 +
                local_160 * 2.02303245e-09 +
                local_168 * -3.526381516666666e-06 +
                local_148 * 0.002374560255 +
                local_178 * -4.30179801 + local_128 * 294.80804 + 0.5851355599999999;
    local_190 = local_158 * -1.235757375e-13 +
                local_160 * 3.854837933333333e-10 +
                local_168 * 2.475020966666667e-08 +
                local_148 * -0.003284612905 +
                local_178 * -3.38875365 + local_128 * -17663.1465 + -3.39660955;
    local_188 = local_158 * 1.2224275e-13 +
                local_160 * -4.701262500000001e-10 +
                local_168 * 6.605369999999999e-07 +
                local_148 * -0.00070412 +
                local_178 * -3.298677 + local_128 * -1020.9 + -0.6516950000000001;
  }
  local_40 = local_1d0;
  local_48 = &local_178;
  local_28 = local_130;
  local_30 = local_138;
  local_38 = local_140;
  *local_130 = local_140[1] * local_140[3];
  *local_138 = local_140[6];
  local_130[1] = local_140[7];
  local_138[1] = local_140[5] * local_140[5];
  local_130[2] = *local_140;
  local_138[2] = local_140[3] * local_140[3];
  local_130[3] = local_140[4] * local_140[4];
  local_138[3] = local_140[1];
  local_130[4] = local_140[3] * local_140[4];
  local_138[4] = local_140[5];
  local_130[5] = local_140[3] * local_140[5];
  local_138[5] = local_140[2];
  local_130[6] = local_140[1] * local_140[3];
  local_138[6] = local_140[4] * local_140[5];
  local_130[7] = *local_140 * local_140[4];
  local_138[7] = local_140[3] * local_140[5];
  local_130[8] = *local_140 * local_140[5];
  local_138[8] = local_140[2] * local_140[3];
  local_130[9] = local_140[2] * local_140[4];
  local_138[9] = local_140[5] * local_140[5];
  local_130[10] = local_140[3] * local_140[6];
  local_138[10] = *local_140 * local_140[1];
  local_130[0xb] = local_140[3] * local_140[6];
  local_138[0xb] = local_140[5] * local_140[5];
  local_130[0xc] = local_140[4] * local_140[6];
  local_138[0xc] = local_140[1] * local_140[5];
  local_130[0xd] = local_140[5] * local_140[6];
  local_138[0xd] = local_140[1] * local_140[2];
  local_130[0xe] = local_140[6] * local_140[6];
  local_138[0xe] = local_140[1] * local_140[7];
  local_130[0xf] = local_140[6] * local_140[6];
  local_138[0xf] = local_140[1] * local_140[7];
  local_130[0x10] = local_140[3] * local_140[7];
  local_138[0x10] = local_140[2] * local_140[5];
  local_130[0x11] = local_140[3] * local_140[7];
  local_138[0x11] = *local_140 * local_140[6];
  local_130[0x12] = local_140[4] * local_140[7];
  local_138[0x12] = local_140[5] * local_140[6];
  local_130[0x13] = local_140[5] * local_140[7];
  local_138[0x13] = local_140[2] * local_140[6];
  local_130[0x14] = local_140[5] * local_140[7];
  local_138[0x14] = local_140[2] * local_140[6];
  local_58 = 0.0;
  for (local_5c = 0; local_5c < 9; local_5c = local_5c + 1) {
    local_58 = local_140[local_5c] + local_58;
  }
  local_8 = &local_a8;
  local_20 = 1.0 / local_148;
  if (1000.0 <= local_148) {
    local_a8 = dVar4 * -7.91375895e-17 +
               dVar3 * 7.692981816666667e-13 +
               dVar2 * 9.389714483333333e-09 +
               local_148 * -0.0003500322055 +
               dVar1 * -2.99142337 + local_20 * -835.033997 + 4.34653354;
    local_a0 = dVar4 * 5.68217655e-17 +
               dVar3 * -1.479401233333333e-12 +
               dVar2 * 2.098069983333333e-08 +
               local_148 * -0.0003067598445 +
               dVar1 * -3.69757819 + local_20 * -1233.93018 + 0.5084126000000002;
    local_98 = dVar4 * 3.195808935e-16 +
               dVar3 * -1.000830325e-11 +
               dVar2 * 1.455043351666667e-07 +
               local_148 * -0.001528146445 +
               dVar1 * -2.67214561 + local_20 * -29899.209 + -4.190671200000001;
    local_90 = dVar4 * -0.0 +
               dVar3 * -0.0 +
               dVar2 * -0.0 + local_148 * -0.0 + dVar1 * -2.5 + local_20 * 25471.627 + 2.960117638;
    local_88 = dVar4 * 2.18402575e-17 +
               dVar3 * -3.792556183333333e-13 +
               dVar2 * 5.171338916666667e-10 +
               local_148 * 1.377530955e-05 +
               dVar1 * -2.54205966 + local_20 * 29230.8027 + -2.37824845;
    local_80 = dVar4 * 6.6597938e-17 +
               dVar3 * -2.54348895e-12 +
               dVar2 * 4.318045966666667e-08 +
               local_148 * -0.00052825224 +
               dVar1 * -2.86472886 + local_20 * 3683.62875 + -2.83691187;
    local_78 = dVar4 * 5.39542675e-16 +
               dVar3 * -9.520530833333334e-12 +
               dVar2 * 1.056096916666667e-07 +
               local_148 * -0.001119910065 +
               dVar1 * -4.0172109 + local_20 * 111.856713 + 0.2321087500000001;
    local_70 = dVar4 * 7.1582678e-16 +
               dVar3 * -1.957419641666667e-11 +
               dVar2 * 2.4578147e-07 +
               local_148 * -0.002168068195 +
               dVar1 * -4.57316685 + local_20 * -18006.9609 + 4.072029891;
    local_68 = dVar4 * 3.3766755e-16 +
               dVar3 * -8.4142e-12 +
               dVar2 * 9.474601666666666e-08 +
               local_148 * -0.0007439885 + dVar1 * -2.92664 + local_20 * -922.7977 + -3.053888;
  }
  else {
    local_a8 = dVar4 * -2.06743612e-14 +
               dVar3 * 7.896195275e-12 +
               dVar2 * 1.357169215e-07 +
               local_148 * -0.000412472087 +
               dVar1 * -3.29812431 + local_20 * -1012.52087 + 6.5922184;
    local_a0 = dVar4 * 4.38427696e-14 +
               dVar3 * -1.094897691666667e-10 +
               dVar2 * 9.593584116666666e-08 +
               local_148 * -0.000563743175 +
               dVar1 * -3.2129364 + local_20 * -1005.24902 + -2.82180119;
    local_98 = dVar4 * 1.253294235e-13 +
               dVar3 * -5.807151058333333e-10 +
               dVar2 * 1.059116055e-06 +
               local_148 * -0.00173749123 +
               dVar1 * -3.38684249 + local_20 * -30208.1133 + 0.7966096399999998;
    local_90 = dVar4 * -0.0 +
               dVar3 * -0.0 +
               dVar2 * -0.0 + local_148 * -0.0 + dVar1 * -2.5 + local_20 * 25471.627 + 2.960117608;
    local_88 = dVar4 * -1.94534818e-14 +
               dVar3 * 1.335702658333333e-10 +
               dVar2 * -4.035052833333333e-07 +
               local_148 * 0.000819083245 +
               dVar1 * -2.94642878 + local_20 * 29147.6445 + -0.01756619999999964;
    local_80 = dVar4 * -1.031186895e-13 +
               dVar3 * 4.832113691666666e-10 +
               dVar2 * -1.087941151666667e-06 +
               local_148 * 0.001612724695 + dVar1 * -4.12530561 + local_20 * 3346.30913 + 4.81573857
    ;
    local_78 = dVar4 * -4.646125620000001e-13 +
               dVar3 * 2.02303245e-09 +
               dVar2 * -3.526381516666666e-06 +
               local_148 * 0.002374560255 +
               dVar1 * -4.30179801 + local_20 * 294.80804 + 0.5851355599999999;
    local_70 = dVar4 * -1.235757375e-13 +
               dVar3 * 3.854837933333333e-10 +
               dVar2 * 2.475020966666667e-08 +
               local_148 * -0.003284612905 +
               dVar1 * -3.38875365 + local_20 * -17663.1465 + -3.39660955;
    local_68 = dVar4 * 1.2224275e-13 +
               dVar3 * -4.701262500000001e-10 +
               dVar2 * 6.605369999999999e-07 +
               local_148 * -0.00070412 +
               dVar1 * -3.298677 + local_20 * -1020.9 + -0.6516950000000001;
  }
  local_b0 = local_180 * 12186.6002121605;
  local_b8 = 1.0 / local_b0;
  dVar5 = local_178 * -0.406;
  local_178 = dVar1;
  local_168 = dVar2;
  local_160 = dVar3;
  local_158 = dVar4;
  local_50 = local_180;
  local_10 = local_48;
  dVar1 = exp(dVar5 + -(local_180 * 8352.89343569254));
  dVar1 = dVar1 * 3547000000.0;
  local_28[6] = dVar1 * local_28[6];
  local_c0 = dVar1;
  dVar2 = exp(-(((local_a0 + local_90) - local_88) - local_80));
  local_30[6] = dVar1 * dVar2 * local_30[6];
  dVar1 = exp(*local_48 * 2.67 + -(local_50 * 3165.23282791169));
  dVar1 = dVar1 * 0.0508;
  local_28[7] = dVar1 * local_28[7];
  local_c0 = dVar1;
  dVar2 = exp(-(((local_a8 - local_90) + local_88) - local_80));
  local_30[7] = dVar1 * dVar2 * local_30[7];
  dVar1 = exp(*local_48 * 1.51 + -(local_50 * 1726.03316371019));
  dVar1 = dVar1 * 216.0;
  local_28[8] = dVar1 * local_28[8];
  local_c0 = dVar1;
  dVar2 = exp(-(((local_a8 - local_98) - local_90) + local_80));
  local_30[8] = dVar1 * dVar2 * local_30[8];
  dVar1 = exp(*local_48 * 2.02 + -(local_50 * 6743.10332178324));
  dVar1 = dVar1 * 2.97;
  local_28[9] = dVar1 * local_28[9];
  local_c0 = dVar1;
  dVar2 = exp(-((local_98 + local_88) - (local_80 + local_80)));
  local_30[9] = dVar1 * dVar2 * local_30[9];
  local_c0 = exp(*local_48 * -1.4 + -(local_50 * 52525.7555766966));
  local_c0 = local_c0 * 45770000000000.0;
  local_c8 = local_38[2] * 11.0 + *local_38 * 1.5 + local_58;
  local_28[2] = local_c8 * local_c0 * local_28[2];
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-(local_a8 - (local_90 + local_90)));
  local_30[2] = dVar1 * dVar2 * local_b8 * local_30[2];
  local_c0 = exp(*local_48 * -0.5);
  local_c0 = local_c0 * 6165.0;
  local_c8 = local_38[2] * 11.0 + *local_38 * 1.5 + local_58;
  local_28[3] = local_c8 * local_c0 * local_28[3];
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-(local_88 + local_88 + -local_a0));
  local_30[3] = dVar1 * dVar2 * local_b0 * local_30[3];
  local_c0 = exp(*local_48 * -1.0);
  local_c0 = local_c0 * 4714000.0;
  local_c8 = local_38[2] * 11.0 + *local_38 * 1.5 + local_58;
  local_28[4] = local_c8 * local_c0 * local_28[4];
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-((local_90 + local_88) - local_80));
  local_30[4] = dVar1 * dVar2 * local_b0 * local_30[4];
  local_c0 = exp(*local_48 * -2.0);
  local_c0 = local_c0 * 38000000000.0;
  local_c8 = local_38[2] * 11.0 + *local_38 * 1.5 + local_58;
  local_28[5] = local_c8 * local_c0 * local_28[5];
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-(-local_98 + local_90 + local_80));
  local_30[5] = dVar1 * dVar2 * local_b0 * local_30[5];
  local_c0 = exp(*local_48 * 0.6);
  local_c0 = local_c0 * 1475000.0;
  local_c8 = local_38[2] * 10.0 + local_38[1] * -0.22 + local_58 + *local_38;
  dVar1 = local_c8 / local_c0;
  local_d0 = exp(*local_48 * -1.72 + -(local_50 * 264.08810621431707));
  local_d0 = dVar1 * 1e-12 * 6.366e+20 * local_d0;
  local_d8 = local_d0 / (local_d0 + 1.0);
  local_e0 = log10(local_d0);
  dVar1 = exp(-local_48[1] * 1e+30);
  dVar2 = exp(-local_48[1] * 1e-30);
  local_e8 = log10(dVar1 * 0.2 + dVar2 * 0.8 + 0.0);
  local_f0 = local_e8 * -0.67 + -0.4;
  local_f8 = local_e8 * -1.27 + 0.75;
  local_100 = (local_f0 + local_e0) / ((local_f0 + local_e0) * -0.14 + local_f8);
  local_108 = pow(10.0,local_e8 / (local_100 * local_100 + 1.0));
  local_c8 = local_d8 * local_108;
  *local_28 = local_c8 * local_c0 * *local_28;
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-((local_a0 + local_90) - local_78));
  *local_30 = dVar1 * dVar2 * local_b0 * *local_30;
  dVar1 = exp(local_50 * -414.147315957284);
  dVar1 = dVar1 * 16600000.0;
  local_28[10] = dVar1 * local_28[10];
  local_c0 = dVar1;
  dVar2 = exp(-((-local_a8 - local_a0) + local_90 + local_78));
  local_30[10] = dVar1 * dVar2 * local_30[10];
  dVar1 = exp(local_50 * -148.448916412392);
  dVar1 = dVar1 * 70790000.0;
  local_28[0xb] = dVar1 * local_28[0xb];
  local_c0 = dVar1;
  dVar2 = exp(-((local_90 - (local_80 + local_80)) + local_78));
  local_30[0xb] = dVar1 * dVar2 * local_30[0xb];
  local_c0 = 32500000.0;
  local_28[0xc] = local_28[0xc] * 32500000.0;
  dVar1 = exp(-(((-local_a0 + local_88) - local_80) + local_78));
  local_30[0xc] = dVar1 * 32500000.0 * local_30[0xc];
  dVar1 = exp(local_50 * 250.098682904946);
  dVar1 = dVar1 * 28900000.0;
  local_28[0xd] = dVar1 * local_28[0xd];
  local_c0 = dVar1;
  dVar2 = exp(-((-local_a0 - local_98) + local_80 + local_78));
  local_30[0xd] = dVar1 * dVar2 * local_30[0xd];
  dVar1 = exp(local_50 * -6029.54208967215);
  dVar1 = dVar1 * 420000000.0;
  local_28[0xe] = dVar1 * local_28[0xe];
  local_c0 = dVar1;
  dVar2 = exp(-((local_78 + local_78 + -local_a0) - local_70));
  local_30[0xe] = dVar1 * dVar2 * local_30[0xe];
  dVar1 = exp(local_50 * 819.89091359563);
  dVar1 = dVar1 * 130000.0;
  local_28[0xf] = dVar1 * local_28[0xf];
  local_c0 = dVar1;
  dVar2 = exp(-((local_78 + local_78 + -local_a0) - local_70));
  local_30[0xf] = dVar1 * dVar2 * local_30[0xf];
  local_c0 = exp(local_50 * -24370.7831249226);
  local_c0 = local_c0 * 295100000000000.0;
  local_c8 = local_38[2] * 11.0 + *local_38 * 1.5 + local_58;
  dVar1 = local_c8 / local_c0;
  local_d0 = exp(*local_48 * 0.0 + -(local_50 * 22896.35829411476));
  local_d0 = dVar1 * 1e-06 * 1.202e+17 * local_d0;
  local_d8 = local_d0 / (local_d0 + 1.0);
  local_e0 = log10(local_d0);
  dVar1 = exp(-local_48[1] * 1e+30);
  dVar2 = exp(-local_48[1] * 1e-30);
  local_e8 = log10(dVar1 * 0.5 + dVar2 * 0.5 + 0.0);
  local_f0 = local_e8 * -0.67 + -0.4;
  local_f8 = local_e8 * -1.27 + 0.75;
  local_100 = (local_f0 + local_e0) / ((local_f0 + local_e0) * -0.14 + local_f8);
  local_108 = pow(10.0,local_e8 / (local_100 * local_100 + 1.0));
  local_c8 = local_d8 * local_108;
  local_28[1] = local_c8 * local_c0 * local_28[1];
  dVar1 = local_c8 * local_c0;
  dVar2 = exp(-(local_70 - (local_80 + local_80)));
  local_30[1] = dVar1 * dVar2 * local_b8 * local_30[1];
  dVar1 = exp(local_50 * -1997.77016324474);
  dVar1 = dVar1 * 24100000.0;
  local_28[0x10] = dVar1 * local_28[0x10];
  local_c0 = dVar1;
  dVar2 = exp(-(((-local_98 + local_90) - local_80) + local_70));
  local_30[0x10] = dVar1 * dVar2 * local_30[0x10];
  dVar1 = exp(local_50 * -4000.57249314752);
  dVar1 = dVar1 * 48200000.0;
  local_28[0x11] = dVar1 * local_28[0x11];
  local_c0 = dVar1;
  dVar2 = exp(-(((-local_a8 + local_90) - local_78) + local_70));
  local_30[0x11] = dVar1 * dVar2 * local_30[0x11];
  dVar1 = exp(*local_48 + *local_48 + -(local_50 * 1997.77016324474));
  dVar1 = dVar1 * 9.55;
  local_28[0x12] = dVar1 * local_28[0x12];
  local_c0 = dVar1;
  dVar2 = exp(-(((local_88 - local_80) - local_78) + local_70));
  local_30[0x12] = dVar1 * dVar2 * local_30[0x12];
  local_c0 = 1000000.0;
  local_28[0x13] = local_28[0x13] * 1000000.0;
  dVar1 = exp(-(((-local_98 + local_80) - local_78) + local_70));
  local_30[0x13] = dVar1 * 1000000.0 * local_30[0x13];
  dVar1 = exp(local_50 * -4809.24167509571);
  dVar1 = dVar1 * 580000000.0;
  local_28[0x14] = dVar1 * local_28[0x14];
  local_c0 = dVar1;
  dVar2 = exp(-(((-local_98 + local_80) - local_78) + local_70));
  local_30[0x14] = dVar1 * dVar2 * local_30[0x14];
  return;
}

Assistant:

void
progressRateFR(
  amrex::Real* q_f, amrex::Real* q_r, amrex::Real* sc, amrex::Real T)
{
  const amrex::Real tc[5] = {
    log(T), T, T * T, T * T * T, T * T * T * T}; // temperature cache
  amrex::Real invT = 1.0 / tc[1];
  // compute the Gibbs free energy
  amrex::Real g_RT[9];
  gibbs(g_RT, tc);

  amrex::Real sc_qss[1];
  amrex::Real kf_qss[0], qf_qss[0], qr_qss[0];
  comp_qfqr(q_f, q_r, sc, sc_qss, tc, invT);

  return;
}